

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O1

void __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
FreeBucket(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
          DListBase<Memory::CustomHeap::Page,_RealCount> *bucket,bool freeOnlyEmptyPages)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Page *page;
  undefined1 local_40 [8];
  EditingIterator pageIter;
  
  if (this->inDtor == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x3da,"(inDtor)","inDtor");
    if (!bVar2) {
LAB_006aa1c9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_40 = (undefined1  [8])bucket;
  pageIter.super_Iterator.list = bucket;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (pageIter.super_Iterator.list == (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_006aa1c9;
      *puVar3 = 0;
    }
    pageIter.super_Iterator.list =
         ((pageIter.super_Iterator.list)->super_DListNodeBase<Memory::CustomHeap::Page>).next.list;
    if ((undefined1  [8])pageIter.super_Iterator.list == local_40) {
      return;
    }
    page = DListBase<Memory::CustomHeap::Page,_RealCount>::Iterator::Data((Iterator *)local_40);
    if ((!freeOnlyEmptyPages) || ((page->freeBitVector).word == 0xffffffffffffffff)) {
      FreePage(this,page);
      DListBase<Memory::CustomHeap::Page,_RealCount>::EditingIterator::
      RemoveCurrent<Memory::ArenaAllocator>((EditingIterator *)local_40,this->auxiliaryAllocator);
    }
  } while( true );
}

Assistant:

void Heap<TAlloc, TPreReservedAlloc>::FreeBucket(DListBase<Page>* bucket, bool freeOnlyEmptyPages)
{
    // CodePageAllocators is locked in FreeAll
    Assert(inDtor);
    FOREACH_DLISTBASE_ENTRY_EDITING(Page, page, bucket, pageIter)
    {
        // Templatize this to remove branches/make code more compact?
        if (!freeOnlyEmptyPages || page.IsEmpty())
        {
            FreePage(&page);
            pageIter.RemoveCurrent(this->auxiliaryAllocator);
        }
    }
    NEXT_DLISTBASE_ENTRY_EDITING;
}